

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseExtrasAndExtensions<tinygltf::Model>
               (Model *target,string *err,json *o,bool store_json_strings)

{
  bool bVar1;
  json *pjVar2;
  detail local_a8 [32];
  undefined1 local_88 [8];
  json_const_iterator it_1;
  undefined1 local_48 [8];
  json_const_iterator it;
  bool store_json_strings_local;
  json *o_local;
  string *err_local;
  Model *target_local;
  
  it.m_it.primitive_iterator.m_it._7_1_ = store_json_strings;
  ParseExtensionsProperty(&target->extensions,err,o);
  ParseExtrasProperty(&target->extras,o);
  if ((it.m_it.primitive_iterator.m_it._7_1_ & 1) != 0) {
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_48);
    bVar1 = detail::FindMember(o,"extensions",(json_const_iterator *)local_48);
    if (bVar1) {
      pjVar2 = detail::GetValue((json_const_iterator *)local_48);
      detail::JsonToString((detail *)&it_1.m_it.primitive_iterator,pjVar2,-1);
      std::__cxx11::string::operator=
                ((string *)&target->extensions_json_string,(string *)&it_1.m_it.primitive_iterator);
      std::__cxx11::string::~string((string *)&it_1.m_it.primitive_iterator);
    }
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_88);
    bVar1 = detail::FindMember(o,"extras",(json_const_iterator *)local_88);
    if (bVar1) {
      pjVar2 = detail::GetValue((json_const_iterator *)local_88);
      detail::JsonToString(local_a8,pjVar2,-1);
      std::__cxx11::string::operator=((string *)&target->extras_json_string,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  return true;
}

Assistant:

static bool ParseExtrasAndExtensions(GltfType *target, std::string *err,
                                     const detail::json &o,
                                     bool store_json_strings) {
  ParseExtensionsProperty(&target->extensions, err, o);
  ParseExtrasProperty(&target->extras, o);

  if (store_json_strings) {
    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extensions", it)) {
        target->extensions_json_string =
            detail::JsonToString(detail::GetValue(it));
      }
    }
    {
      detail::json_const_iterator it;
      if (detail::FindMember(o, "extras", it)) {
        target->extras_json_string = detail::JsonToString(detail::GetValue(it));
      }
    }
  }
  return true;
}